

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall duckdb_re2::RE2::CapturingGroupNames_abi_cxx11_(RE2 *this)

{
  long in_RDI;
  RE2 **unaff_retaddr;
  anon_class_1_0_00000001 *in_stack_00000008;
  once_flag *in_stack_00000010;
  
  std::call_once<duckdb_re2::RE2::CapturingGroupNames[abi:cxx11]()const::__0,duckdb_re2::RE2_const*>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return *(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           **)(in_RDI + 0x80);
}

Assistant:

const std::map<int, std::string>& RE2::CapturingGroupNames() const {
  std::call_once(group_names_once_, [](const RE2* re) {
    if (re->suffix_regexp_ != NULL)
      re->group_names_ = re->suffix_regexp_->CaptureNames();
    if (re->group_names_ == NULL)
      re->group_names_ = empty_group_names();
  }, this);
  return *group_names_;
}